

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZLinearAnalysis.cpp
# Opt level: O3

TPZMatrixSolver<double> * __thiscall
TPZLinearAnalysis::MatrixSolver<double>(TPZLinearAnalysis *this)

{
  TPZMatrixSolver<double> *pTVar1;
  TPZRestoreClassBase *extraout_RAX;
  TPZMatrixSolver<double> *extraout_RAX_00;
  TPZSolver *pTVar2;
  _func_int **pp_Var3;
  TPZRestoreClassBase *restore;
  
  pTVar2 = (this->super_TPZAnalysis).fSolver;
  pTVar1 = (TPZMatrixSolver<double> *)
           __dynamic_cast(pTVar2,&TPZSolver::typeinfo,&TPZMatrixSolver<double>::typeinfo,0);
  if (pTVar1 != (TPZMatrixSolver<double> *)0x0) {
    return pTVar1;
  }
  MatrixSolver<double>();
  pp_Var3 = pTVar2[0x2e].super_TPZSavable._vptr_TPZSavable;
  restore = extraout_RAX;
  pTVar1 = (TPZMatrixSolver<double> *)
           __dynamic_cast(pp_Var3,&TPZSolver::typeinfo,
                          &TPZMatrixSolver<std::complex<double>>::typeinfo,0);
  if (pTVar1 != (TPZMatrixSolver<double> *)0x0) {
    return pTVar1;
  }
  MatrixSolver<std::complex<double>>();
  *pp_Var3 = (_func_int *)&PTR_Restore_01967ea8;
  TPZSavable::Register(restore);
  return extraout_RAX_00;
}

Assistant:

TPZMatrixSolver<TVar> &TPZLinearAnalysis::MatrixSolver(){
    const auto tmp = dynamic_cast<TPZMatrixSolver<TVar>*>(fSolver);
    if(fSolver && !tmp){
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" incompatible Solver type! Aborting\n";
        DebugStop();
    }
    return *tmp;
}